

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> * __thiscall
kj::ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::operator=
          (ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *this,
          ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *other)

{
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar1;
  RemoveConst<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *pRVar2;
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar3;
  ArrayDisposer *pAVar4;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
    this->pos = (RemoveConst<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)0x0;
    this->endPtr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Array<capnp::Orphan<capnp::compiler::Token>_>,_false>::
               destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  other->pos = (RemoveConst<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)0x0;
  other->endPtr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }